

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

double l2norm(double *vec,int N)

{
  double dVar1;
  int local_2c;
  double dStack_28;
  int i;
  double sum;
  double l2;
  int N_local;
  double *vec_local;
  
  dStack_28 = 0.0;
  for (local_2c = 0; local_2c < N; local_2c = local_2c + 1) {
    dStack_28 = vec[local_2c] * vec[local_2c] + dStack_28;
  }
  dVar1 = sqrt(dStack_28);
  return dVar1;
}

Assistant:

double l2norm(double *vec, int N) {
	double l2, sum;
	int i;
	sum = 0.;
	for (i = 0; i < N; ++i) {
		sum += vec[i] * vec[i];
	}
	l2 = sqrt(sum);
	return l2;
}